

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O0

bool __thiscall ON_Matrix::Add(ON_Matrix *this,ON_Matrix *a,ON_Matrix *b)

{
  int iVar1;
  int iVar2;
  double **ppdVar3;
  double **ppdVar4;
  double **ppdVar5;
  double **this_m;
  double **bm;
  double **am;
  int j;
  int i;
  ON_Matrix *b_local;
  ON_Matrix *a_local;
  ON_Matrix *this_local;
  
  iVar1 = ColCount(a);
  iVar2 = ColCount(b);
  if (iVar1 == iVar2) {
    iVar1 = RowCount(a);
    iVar2 = RowCount(b);
    if (((iVar1 == iVar2) && (iVar1 = RowCount(a), 0 < iVar1)) && (iVar1 = ColCount(a), 0 < iVar1))
    {
      if ((this != a) && (this != b)) {
        iVar1 = RowCount(a);
        iVar2 = ColCount(b);
        Create(this,iVar1,iVar2);
      }
      ppdVar3 = ThisM(a);
      ppdVar4 = ThisM(b);
      ppdVar5 = ThisM(this);
      for (am._4_4_ = 0; am._4_4_ < this->m_row_count; am._4_4_ = am._4_4_ + 1) {
        for (am._0_4_ = 0; (int)am < this->m_col_count; am._0_4_ = (int)am + 1) {
          ppdVar5[am._4_4_][(int)am] = ppdVar3[am._4_4_][(int)am] + ppdVar4[am._4_4_][(int)am];
        }
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_Matrix::Add( const ON_Matrix& a, const ON_Matrix& b )
{
  int i, j;
  if (a.ColCount() != b.ColCount() )
    return false;
  if (a.RowCount() != b.RowCount() )
    return false;
  if ( a.RowCount() < 1 || a.ColCount() < 1 )
    return false;
  if ( this != &a && this != &b ) {
    Create( a.RowCount(), b.ColCount() );
  }
  double const*const* am = a.ThisM();
  double const*const* bm = b.ThisM();
  double** this_m = ThisM();
  for ( i = 0; i < m_row_count; i++ ) for ( j = 0; j < m_col_count; j++ ) {
    this_m[i][j] = am[i][j] + bm[i][j];
  }
  return true;  
}